

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::SetupNodeMetadata(FBXConverter *this,Model *model,aiNode *nd)

{
  _Rb_tree_node_base *key;
  ulong uVar1;
  PropertyTable *this_00;
  aiMetadata *this_01;
  TypedProperty<bool> *pTVar2;
  TypedProperty<int> *pTVar3;
  TypedProperty<unsigned_long> *pTVar4;
  TypedProperty<float> *pTVar5;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pTVar6;
  TypedProperty<aiVector3t<float>_> *pTVar7;
  _Base_ptr p_Var8;
  uint index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  size_t sVar9;
  allocator<char> local_4eb;
  allocator<char> local_4ea;
  allocator<char> local_4e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8;
  string local_4a8;
  undefined1 local_488 [32];
  DirectPropertyMap unparsedProperties;
  aiString local_438;
  
  this_00 = Model::Props(model);
  PropertyTable::GetUnparsedProperties_abi_cxx11_(&unparsedProperties,this_00);
  this_01 = aiMetadata::Alloc((int)unparsedProperties._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count + 2);
  nd->mMetaData = this_01;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"UserProperties",&local_4e9);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_488,"UDP3DSMAX",&local_4ea);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"",&local_4eb);
  PropertyGet<std::__cxx11::string>
            (&local_4e8,(FBX *)this_00,(PropertyTable *)local_488,&local_4a8,in_R8);
  sVar9 = 0x3ff;
  if ((local_4e8._M_string_length & 0xfffffc00) == 0) {
    sVar9 = local_4e8._M_string_length & 0xffffffff;
  }
  local_438.length = (ai_uint32)sVar9;
  memcpy(local_438.data,
         (void *)CONCAT71(local_4e8._M_dataplus._M_p._1_7_,local_4e8._M_dataplus._M_p._0_1_),sVar9);
  local_438.data[sVar9] = '\0';
  aiMetadata::Set<aiString>(this_01,0,&local_4c8,&local_438);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)local_488);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"IsNull",(allocator<char> *)&local_4c8);
  local_4e8._M_dataplus._M_p._0_1_ = Model::IsNull(model);
  aiMetadata::Set<bool>(this_01,1,(string *)&local_438,(bool *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_438);
  index = 2;
  p_Var8 = unparsedProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var8 == &unparsedProperties._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
      ::~_Rb_tree(&unparsedProperties._M_t);
      return;
    }
    key = p_Var8 + 1;
    pTVar2 = Property::As<Assimp::FBX::TypedProperty<bool>>(*(Property **)(p_Var8 + 2));
    if (pTVar2 == (TypedProperty<bool> *)0x0) {
      pTVar3 = Property::As<Assimp::FBX::TypedProperty<int>>(*(Property **)(p_Var8 + 2));
      if (pTVar3 == (TypedProperty<int> *)0x0) {
        pTVar4 = Property::As<Assimp::FBX::TypedProperty<unsigned_long>>(*(Property **)(p_Var8 + 2))
        ;
        if (pTVar4 == (TypedProperty<unsigned_long> *)0x0) {
          pTVar5 = Property::As<Assimp::FBX::TypedProperty<float>>(*(Property **)(p_Var8 + 2));
          if (pTVar5 == (TypedProperty<float> *)0x0) {
            pTVar6 = Property::As<Assimp::FBX::TypedProperty<std::__cxx11::string>>
                               (*(Property **)(p_Var8 + 2));
            if (pTVar6 == (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x0) {
              pTVar7 = Property::As<Assimp::FBX::TypedProperty<aiVector3t<float>>>
                                 (*(Property **)(p_Var8 + 2));
              if (pTVar7 == (TypedProperty<aiVector3t<float>_> *)0x0) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                              ,0x387,
                              "void Assimp::FBX::FBXConverter::SetupNodeMetadata(const Model &, aiNode &)"
                             );
              }
              aiMetadata::Set<aiVector3t<float>>(this_01,index,(string *)key,&pTVar7->value);
            }
            else {
              uVar1 = (pTVar6->value)._M_string_length;
              sVar9 = uVar1 & 0xffffffff;
              if ((uVar1 & 0xfffffc00) != 0) {
                sVar9 = 0x3ff;
              }
              local_438.length = (ai_uint32)sVar9;
              memcpy(local_438.data,(pTVar6->value)._M_dataplus._M_p,sVar9);
              local_438.data[sVar9] = '\0';
              aiMetadata::Set<aiString>(this_01,index,(string *)key,&local_438);
            }
          }
          else {
            aiMetadata::Set<float>(this_01,index,(string *)key,&pTVar5->value);
          }
        }
        else {
          aiMetadata::Set<unsigned_long>(this_01,index,(string *)key,&pTVar4->value);
        }
      }
      else {
        aiMetadata::Set<int>(this_01,index,(string *)key,&pTVar3->value);
      }
    }
    else {
      aiMetadata::Set<bool>(this_01,index,(string *)key,&pTVar2->value);
    }
    index = index + 1;
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

void FBXConverter::SetupNodeMetadata(const Model& model, aiNode& nd)
        {
            const PropertyTable& props = model.Props();
            DirectPropertyMap unparsedProperties = props.GetUnparsedProperties();

            // create metadata on node
            const std::size_t numStaticMetaData = 2;
            aiMetadata* data = aiMetadata::Alloc(static_cast<unsigned int>(unparsedProperties.size() + numStaticMetaData));
            nd.mMetaData = data;
            int index = 0;

            // find user defined properties (3ds Max)
            data->Set(index++, "UserProperties", aiString(PropertyGet<std::string>(props, "UDP3DSMAX", "")));
            // preserve the info that a node was marked as Null node in the original file.
            data->Set(index++, "IsNull", model.IsNull() ? true : false);

            // add unparsed properties to the node's metadata
            for (const DirectPropertyMap::value_type& prop : unparsedProperties) {
                // Interpret the property as a concrete type
                if (const TypedProperty<bool>* interpreted = prop.second->As<TypedProperty<bool> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<int>* interpreted = prop.second->As<TypedProperty<int> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<uint64_t>* interpreted = prop.second->As<TypedProperty<uint64_t> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<float>* interpreted = prop.second->As<TypedProperty<float> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<std::string>* interpreted = prop.second->As<TypedProperty<std::string> >()) {
                    data->Set(index++, prop.first, aiString(interpreted->Value()));
                }
                else if (const TypedProperty<aiVector3D>* interpreted = prop.second->As<TypedProperty<aiVector3D> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else {
                    ai_assert(false);
                }
            }
        }